

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.h
# Opt level: O2

void __thiscall
ClearWrapperCommand::wrapperAction(ClearWrapperCommand *this,ExeElementWrapper *wrapper)

{
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  
  if (wrapper != (ExeElementWrapper *)0x0) {
    bVar1 = AbstractByteBuffer::fillContent(&wrapper->super_AbstractByteBuffer,'\0');
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to fill...");
      std::endl<char,std::char_traits<char>>(poVar2);
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Filled!");
    std::endl<char,std::char_traits<char>>(poVar2);
    if (wrapper->m_Exe != (Executable *)0x0) {
      plVar3 = (long *)__dynamic_cast(wrapper->m_Exe,&Executable::typeinfo,&MappedExe::typeinfo,0);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x100))(plVar3);
        return;
      }
    }
  }
  return;
}

Assistant:

virtual void wrapperAction(ExeElementWrapper *wrapper)
    {
        if (wrapper == NULL) return;
        BYTE filling = 0;
        if (wrapper->fillContent(filling)) {
            std::cout << "Filled!" << std::endl;
        } else {
            std::cout << "Failed to fill..." << std::endl;
            return;
        }
        MappedExe *mExe = dynamic_cast<MappedExe*>(wrapper->getExe());
        if (mExe) {
            mExe->wrap();
        }
    }